

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O1

void ucase_addCaseClosure_63(UChar32 c,USetAdder *sa)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  ushort *puVar5;
  int iVar6;
  USet *pUVar7;
  uint uVar8;
  UChar *pUVar9;
  uint uVar10;
  long lVar11;
  
  if (c < 0x130) {
    if (c == 0x49) {
      pUVar7 = sa->set;
      UNRECOVERED_JUMPTABLE = (code *)sa->add;
      iVar6 = 0x69;
      goto LAB_002bb56a;
    }
    if (c == 0x69) {
      pUVar7 = sa->set;
      UNRECOVERED_JUMPTABLE = (code *)sa->add;
      iVar6 = 0x49;
      goto LAB_002bb56a;
    }
  }
  else {
    if (c == 0x130) {
      (*sa->addString)(sa->set,L"i̇",2);
      return;
    }
    if (c == 0x131) {
      return;
    }
  }
  if ((uint)c < 0xd800) {
    uVar8 = (uint)c >> 5;
LAB_002bb5bd:
    uVar4 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar8] * 4);
  }
  else {
    if ((uint)c < 0x10000) {
      uVar8 = ((uint)c >> 5) + 0x140;
      if (0xdbff < c) {
        uVar8 = (uint)c >> 5;
      }
      goto LAB_002bb5bd;
    }
    uVar4 = 0xd30;
    if (((uint)c < 0x110000) && (uVar4 = 0x2f1c, c < 0xe0800)) {
      uVar8 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
      goto LAB_002bb5bd;
    }
  }
  uVar2 = ucase_props_trieIndex[uVar4];
  if ((uVar2 & 8) == 0) {
    if (0x7f < uVar2 && (uVar2 & 3) != 0) {
      pUVar7 = sa->set;
      UNRECOVERED_JUMPTABLE = (code *)sa->add;
      iVar6 = ((int)(short)uVar2 >> 7) + c;
LAB_002bb56a:
      (*UNRECOVERED_JUMPTABLE)(pUVar7,iVar6);
      return;
    }
  }
  else {
    lVar1 = (ulong)(uVar2 >> 4) * 2;
    lVar11 = lVar1 + 0x34e322;
    uVar2 = ucase_props_exceptions[uVar2 >> 4];
    uVar8 = 0;
    do {
      if ((uVar2 >> (uVar8 & 0x1f) & 1) != 0) {
        uVar4 = (ulong)""[(1 << ((byte)uVar8 & 0x1f)) - 1U & (uint)uVar2];
        if ((uVar2 >> 8 & 1) == 0) {
          c = (UChar32)*(ushort *)(lVar11 + uVar4 * 2);
        }
        else {
          c = CONCAT22(*(undefined2 *)(lVar11 + uVar4 * 4),
                       *(undefined2 *)(lVar1 + 0x34e324 + uVar4 * 4));
        }
        (*(code *)sa->add)(sa->set,c);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
    if ((uVar2 & 0x10) != 0) {
      uVar4 = (ulong)""[uVar2 & 0xf];
      if ((uVar2 >> 8 & 1) == 0) {
        uVar8 = (uint)*(ushort *)(lVar11 + uVar4 * 2);
      }
      else {
        uVar8 = CONCAT22(*(undefined2 *)(lVar11 + uVar4 * 4),
                         *(undefined2 *)(lVar1 + 0x34e324 + uVar4 * 4));
      }
      uVar10 = -uVar8;
      if ((uVar2 >> 10 & 1) == 0) {
        uVar10 = uVar8;
      }
      (*(code *)sa->add)(sa->set,uVar10 + c);
    }
    if ((uVar2 & 0x40) == 0) {
      puVar5 = (ushort *)0x0;
      uVar8 = 0;
    }
    else {
      puVar5 = (ushort *)(lVar1 + 0x34e324 + (ulong)""[uVar2 & 0x3f] * 4);
      if ((uVar2 >> 8 & 1) == 0) {
        puVar5 = (ushort *)(lVar11 + (ulong)""[uVar2 & 0x3f] * 2);
      }
      uVar8 = *puVar5 & 0xf;
      puVar5 = puVar5 + 1;
    }
    if ((char)uVar2 < '\0') {
      puVar5 = (ushort *)(lVar1 + 0x34e324 + (ulong)""[uVar2 & 0x7f] * 4);
      if ((uVar2 >> 8 & 1) == 0) {
        puVar5 = (ushort *)(lVar11 + (ulong)""[uVar2 & 0x7f] * 2);
      }
      uVar2 = *puVar5;
      pUVar9 = (UChar *)(puVar5 + (ulong)(uVar2 & 0xf) + 1);
      uVar10 = uVar2 >> 4 & 0xf;
      if ((uVar2 >> 4 & 0xf) != 0) {
        (*sa->addString)(sa->set,pUVar9,uVar10);
        pUVar9 = pUVar9 + uVar10;
      }
      puVar5 = (ushort *)((long)pUVar9 + (ulong)(uVar2 >> 0xc) * 2 + (ulong)(uVar2 >> 7 & 0x1e));
    }
    if (uVar8 != 0) {
      iVar6 = 0;
      do {
        uVar2 = puVar5[iVar6];
        uVar10 = (uint)uVar2;
        iVar3 = iVar6 + 1;
        if ((uVar2 & 0xfc00) == 0xd800) {
          iVar3 = iVar6 + 2;
          uVar10 = (uint)uVar2 * 0x400 + (uint)puVar5[iVar6 + 1] + 0xfca02400;
        }
        (*(code *)sa->add)(sa->set,uVar10);
        iVar6 = iVar3;
      } while (iVar3 < (int)uVar8);
    }
  }
  return;
}

Assistant:

U_CFUNC void U_EXPORT2
ucase_addCaseClosure(UChar32 c, const USetAdder *sa) {
    uint16_t props;

    /*
     * Hardcode the case closure of i and its relatives and ignore the
     * data file data for these characters.
     * The Turkic dotless i and dotted I with their case mapping conditions
     * and case folding option make the related characters behave specially.
     * This code matches their closure behavior to their case folding behavior.
     */

    switch(c) {
    case 0x49:
        /* regular i and I are in one equivalence class */
        sa->add(sa->set, 0x69);
        return;
    case 0x69:
        sa->add(sa->set, 0x49);
        return;
    case 0x130:
        /* dotted I is in a class with <0069 0307> (for canonical equivalence with <0049 0307>) */
        sa->addString(sa->set, iDot, 2);
        return;
    case 0x131:
        /* dotless i is in a class by itself */
        return;
    default:
        /* otherwise use the data file data */
        break;
    }

    props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_GET_TYPE(props)!=UCASE_NONE) {
            /* add the one simple case mapping, no matter what type it is */
            int32_t delta=UCASE_GET_DELTA(props);
            if(delta!=0) {
                sa->add(sa->set, c+delta);
            }
        }
    } else {
        /*
         * c has exceptions, so there may be multiple simple and/or
         * full case mappings. Add them all.
         */
        const uint16_t *pe0, *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        const UChar *closure;
        uint16_t excWord=*pe++;
        int32_t idx, closureLength, fullLength, length;

        pe0=pe;

        /* add all simple case mappings */
        for(idx=UCASE_EXC_LOWER; idx<=UCASE_EXC_TITLE; ++idx) {
            if(HAS_SLOT(excWord, idx)) {
                pe=pe0;
                GET_SLOT_VALUE(excWord, idx, pe, c);
                sa->add(sa->set, c);
            }
        }
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA)) {
            pe=pe0;
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            sa->add(sa->set, (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta);
        }

        /* get the closure string pointer & length */
        if(HAS_SLOT(excWord, UCASE_EXC_CLOSURE)) {
            pe=pe0;
            GET_SLOT_VALUE(excWord, UCASE_EXC_CLOSURE, pe, closureLength);
            closureLength&=UCASE_CLOSURE_MAX_LENGTH; /* higher bits are reserved */
            closure=(const UChar *)pe+1; /* behind this slot, unless there are full case mappings */
        } else {
            closureLength=0;
            closure=NULL;
        }

        /* add the full case folding */
        if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            pe=pe0;
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, fullLength);

            /* start of full case mapping strings */
            ++pe;

            fullLength&=0xffff; /* bits 16 and higher are reserved */

            /* skip the lowercase result string */
            pe+=fullLength&UCASE_FULL_LOWER;
            fullLength>>=4;

            /* add the full case folding string */
            length=fullLength&0xf;
            if(length!=0) {
                sa->addString(sa->set, (const UChar *)pe, length);
                pe+=length;
            }

            /* skip the uppercase and titlecase strings */
            fullLength>>=4;
            pe+=fullLength&0xf;
            fullLength>>=4;
            pe+=fullLength;

            closure=(const UChar *)pe; /* behind full case mappings */
        }

        /* add each code point in the closure string */
        for(idx=0; idx<closureLength;) {
            U16_NEXT_UNSAFE(closure, idx, c);
            sa->add(sa->set, c);
        }
    }
}